

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Expr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
::ReadSymbolicExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_testing::NiceMock<MockNLHandler>_>
                   *this)

{
  char code;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  int opcode;
  NumericExpr NVar1;
  char *pcVar2;
  MockNLHandler *this_01;
  
  this_00 = this->reader_;
  pcVar2 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
  (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
  code = *pcVar2;
  if (code == 'o') {
    opcode = ReadOpCode(this);
    if (opcode != 0x41) {
      NVar1 = ReadNumericExpr(this,opcode);
      return (Expr)NVar1.id_;
    }
    ReadLogicalExpr(this);
    ReadSymbolicExpr(this);
    ReadSymbolicExpr(this);
    this_01 = &this->handler_->super_MockNLHandler;
    pcVar2 = "symbolic if expression";
  }
  else {
    if (code != 'h') {
      NVar1 = ReadNumericExpr(this,code,false);
      return (Expr)NVar1.id_;
    }
    this_01 = &this->handler_->super_MockNLHandler;
    BinaryReader<mp::internal::EndiannessConverter>::ReadString(this_00);
    pcVar2 = "string";
  }
  MockNLHandler::OnUnhandled(this_01,pcVar2);
  return (Expr)NULL_ID;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}